

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O3

string * __thiscall
Fossilize::encode_base64_abi_cxx11_
          (string *__return_storage_ptr__,Fossilize *this,void *data_,size_t size)

{
  _Alloc_hider *p_Var1;
  string *psVar2;
  char cVar3;
  string *psVar4;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  psVar2 = (string *)std::__cxx11::string::reserve((ulong)__return_storage_ptr__);
  if (data_ != (void *)0x0) {
    psVar4 = (string *)0x2;
    do {
      cVar3 = (char)__return_storage_ptr__;
      std::__cxx11::string::push_back(cVar3);
      std::__cxx11::string::push_back(cVar3);
      std::__cxx11::string::push_back(cVar3);
      std::__cxx11::string::push_back(cVar3);
      psVar2 = (string *)((long)&(psVar4->_M_dataplus)._M_p + 3);
      p_Var1 = &psVar4->_M_dataplus;
      psVar4 = psVar2;
    } while ((void *)((long)&p_Var1->_M_p + 1) < data_);
  }
  return psVar2;
}

Assistant:

static std::string encode_base64(const void *data_, size_t size)
{
	auto *data = static_cast<const uint8_t *>(data_);
	size_t num_chars = 4 * ((size + 2) / 3);
	std::string ret;
	ret.reserve(num_chars);

	for (size_t i = 0; i < size; i += 3)
	{
		uint32_t code = data[i] << 16;
		if (i + 1 < size)
			code |= data[i + 1] << 8;
		if (i + 2 < size)
			code |= data[i + 2] << 0;

		auto c0 = base64((code >> 18) & 63);
		auto c1 = base64((code >> 12) & 63);
		auto c2 = base64((code >>  6) & 63);
		auto c3 = base64((code >>  0) & 63);

		auto outbytes = std::min(size - i, size_t(3));
		if (outbytes == 1)
		{
			c2 = '=';
			c3 = '=';
		}
		else if (outbytes == 2)
			c3 = '=';

		ret.push_back(c0);
		ret.push_back(c1);
		ret.push_back(c2);
		ret.push_back(c3);
	}

	return ret;
}